

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O0

void secp256k1_pedersen_ecmult_small(secp256k1_gej *r,uint64_t gn,secp256k1_ge *genp)

{
  undefined1 local_40 [8];
  secp256k1_scalar s;
  secp256k1_ge *genp_local;
  uint64_t gn_local;
  secp256k1_gej *r_local;
  
  s.d[3] = (uint64_t)genp;
  secp256k1_pedersen_scalar_set_u64((secp256k1_scalar *)local_40,gn);
  secp256k1_ecmult_const(r,(secp256k1_ge *)s.d[3],(secp256k1_scalar *)local_40,0x40);
  secp256k1_scalar_clear((secp256k1_scalar *)local_40);
  return;
}

Assistant:

static void secp256k1_pedersen_ecmult_small(secp256k1_gej *r, uint64_t gn, const secp256k1_ge* genp) {
    secp256k1_scalar s;
    secp256k1_pedersen_scalar_set_u64(&s, gn);
    secp256k1_ecmult_const(r, genp, &s, 64);
    secp256k1_scalar_clear(&s);
}